

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash.c
# Opt level: O2

void test_open_address_hashmap_simple_insert(planck_unit_test_t *tc)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  planck_unit_result_t pVar4;
  ion_err_t iVar5;
  ion_status_t iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int local_8c;
  int local_88;
  ion_byte_t str [10];
  ion_hashmap_t map;
  
  initialize_hash_map_std_conditions(&map);
  local_88 = map.super.record.key_size + 1 + map.super.record.value_size;
  iVar7 = map.map_size;
  for (iVar8 = 0; iVar8 < iVar7; iVar8 = iVar8 + 1) {
    for (local_8c = 0; local_8c < iVar7; local_8c = local_8c + 1) {
      sprintf((char *)str,"%02i is key");
      iVar6 = oah_insert(&map,&local_8c,str);
      if ((iVar8 == 0) || (map.write_concern == '\x02')) {
        pVar4 = planck_unit_assert_true
                          (tc,(uint)(iVar6.error == '\0'),0x119,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar4 == '\0') goto LAB_00101a54;
        pVar4 = planck_unit_assert_true
                          (tc,(uint)(iVar6.count == 1),0x11a,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                           ,"condition was false, expected true");
        if (pVar4 == '\0') goto LAB_00101a54;
      }
      iVar7 = map.map_size;
    }
    for (local_8c = 0; pcVar3 = map.entry, local_8c < iVar7; local_8c = local_8c + 1) {
      uVar2 = (long)(local_8c + iVar8) % (long)iVar7;
      lVar9 = (long)(((int)uVar2 * local_88) % (iVar7 * local_88));
      cVar1 = map.entry[lVar9];
      sprintf((char *)str,"%02i is key",uVar2 & 0xffffffff);
      pVar4 = planck_unit_assert_true
                        (tc,(uint)(cVar1 == -3),0x127,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar4 == '\0') goto LAB_00101a54;
      pVar4 = planck_unit_assert_true
                        (tc,(uint)(*(int *)(pcVar3 + lVar9 + 1) == (local_8c + iVar8) % map.map_size
                                  ),0x129,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                         ,"condition was false, expected true");
      if (pVar4 == '\0') goto LAB_00101a54;
      pVar4 = planck_unit_assert_str_are_equal
                        (tc,(char *)str,pcVar3 + map.super.record.key_size + lVar9 + 1,299,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                        );
      if (pVar4 == '\0') goto LAB_00101a54;
      iVar7 = map.map_size;
    }
  }
  iVar5 = oah_destroy(&map);
  pVar4 = planck_unit_assert_true
                    (tc,(uint)(iVar5 == '\0'),0x12f,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash.c"
                     ,"condition was false, expected true");
  if (pVar4 != '\0') {
    return;
  }
LAB_00101a54:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_hashmap_simple_insert(
	planck_unit_test_t *tc
) {
	/* create handler for hashmap */
	ion_hashmap_t	map;
	int				i;
	int				offset;

	initialize_hash_map_std_conditions(&map);

	/*Manually populate records */
	ion_record_info_t record = map.super.record;

	/* manually populate array */
#if ION_DEBUG

	char *pos_ptr = map.entry;

#endif

	int bucket_size = sizeof(char) + record.key_size + record.value_size;

	for (offset = 0; offset < map.map_size; offset++) {
		/* apply continual offsets */
#if ION_DEBUG
		printf("entry loc: %p %p \n", map.entry, pos_ptr);
		pos_ptr = (map.entry + (offset * bucket_size) % (map.map_size * bucket_size));
#endif

		for (i = 0; i < map.map_size; i++) {
			/* build up the value */
			ion_byte_t str[10];

			sprintf((char *) str, "%02i is key", i);

			ion_status_t status = oah_insert(&map, (&i), str);	/* this is will wrap */

			if ((offset == 0) || (wc_duplicate == map.write_concern)) {
				PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
				PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
			}
		}

		for (i = 0; i < map.map_size; i++) {
			ion_record_status_t status	= ((ion_hash_bucket_t *) (map.entry + ((((i + offset) % map.map_size) * bucket_size) % (map.map_size * bucket_size))))->status;
			ion_key_t			key		= (((ion_hash_bucket_t *) (map.entry + ((((i + offset) % map.map_size) * bucket_size) % (map.map_size * bucket_size))))->data);
			ion_value_t			value	= (((ion_hash_bucket_t *) (map.entry + ((((i + offset) % map.map_size) * bucket_size) % (map.map_size * bucket_size))))->data + record.key_size);

			/* build up expected value */
			ion_byte_t str[10];

			sprintf((char *) str, "%02i is key", (i + offset) % map.map_size);
			PLANCK_UNIT_ASSERT_TRUE(tc, status == ION_IN_USE);
			/* check to ensure key is pointing at correct location */
			PLANCK_UNIT_ASSERT_TRUE(tc, *(int *) key == (i + offset) % map.map_size);
			/* While str and value are unsigned, equality test is signed, so casting required */
			PLANCK_UNIT_ASSERT_STR_ARE_EQUAL(tc, (char *) str, (char *) value);
		}
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == oah_destroy(&map));
}